

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_CCtx_params params_00;
  uint uVar1;
  size_t code;
  size_t errcod_1;
  size_t errcod;
  undefined8 local_dc;
  undefined8 local_d4;
  undefined4 local_cc;
  void *local_c8;
  ZSTD_prefixDict prefixDict;
  ZSTD_CCtx_params params;
  ZSTD_EndDirective endOp_local;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTD_CCtx *cctx_local;
  
  if (output->size < output->pos) {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffff;
  }
  else if (input->size < input->pos) {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffff;
  }
  else {
    if (cctx->streamStage == zcss_init) {
      memcpy(&prefixDict.dictContentType,&cctx->requestedParams,0x80);
      local_c8 = (cctx->prefixDict).dict;
      prefixDict.dict = (void *)(cctx->prefixDict).dictSize;
      prefixDict.dictSize = *(size_t *)&(cctx->prefixDict).dictContentType;
      memset(&cctx->prefixDict,0,0x18);
      if (endOp == ZSTD_e_end) {
        cctx->pledgedSrcSizePlusOne = input->size + 1;
      }
      ZSTD_getCParamsFromCCtxParams
                ((ZSTD_compressionParameters *)((long)&errcod + 4),&cctx->requestedParams,
                 cctx->pledgedSrcSizePlusOne - 1,0);
      prefixDict._20_4_ = SUB84(stack0xffffffffffffff1c,0);
      params.format = (ZSTD_format_e)((ulong)stack0xffffffffffffff1c >> 0x20);
      params.cParams.windowLog = (uint)local_dc;
      params.cParams.chainLog = (uint)((ulong)local_dc >> 0x20);
      params.cParams.hashLog = (uint)local_d4;
      params.cParams.searchLog = (uint)((ulong)local_d4 >> 0x20);
      params_00.cParams.windowLog = prefixDict._20_4_;
      params_00.format = prefixDict.dictContentType;
      params_00.cParams.hashLog = params.cParams.windowLog;
      params_00.cParams.chainLog = params.format;
      params_00.cParams.minMatch = params.cParams.hashLog;
      params_00.cParams.searchLog = params.cParams.chainLog;
      params_00.cParams.strategy = local_cc;
      params_00.cParams.targetLength = params.cParams.searchLog;
      params_00.fParams._0_8_ = params.cParams._20_8_;
      params_00._40_8_ = params.fParams._0_8_;
      params_00._48_8_ = params._40_8_;
      params_00._56_8_ = params._48_8_;
      params_00.jobSize = params._56_8_;
      params_00._72_8_ = params.jobSize;
      params_00.ldmParams._0_8_ = params._72_8_;
      params_00.ldmParams._8_8_ = params.ldmParams._0_8_;
      params_00.ldmParams._16_8_ = params.ldmParams._8_8_;
      params_00.customMem.customAlloc = (ZSTD_allocFunction)params.ldmParams._16_8_;
      params_00.customMem.customFree = (ZSTD_freeFunction)params.customMem.customAlloc;
      params_00.customMem.opaque = params.customMem.customFree;
      code = ZSTD_resetCStream_internal
                       (cctx,local_c8,(size_t)prefixDict.dict,
                        (ZSTD_dictContentType_e)prefixDict.dictSize,cctx->cdict,params_00,
                        cctx->pledgedSrcSizePlusOne - 1);
      uVar1 = ERR_isError(code);
      if (uVar1 != 0) {
        return code;
      }
    }
    cctx_local = (ZSTD_CCtx *)ZSTD_compressStream_generic(cctx,output,input,endOp);
    uVar1 = ERR_isError((size_t)cctx_local);
    if (uVar1 == 0) {
      cctx_local = (ZSTD_CCtx *)(cctx->outBuffContentSize - cctx->outBuffFlushedSize);
    }
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    if (output->pos > output->size) return ERROR(GENERIC);
    if (input->pos  > input->size)  return ERROR(GENERIC);
    assert(cctx!=NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        ZSTD_CCtx_params params = cctx->requestedParams;
        ZSTD_prefixDict const prefixDict = cctx->prefixDict;
        memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
        assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
        DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
        if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = input->size + 1;  /* auto-fix pledgedSrcSize */
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, 0 /*dictSize*/);


#ifdef ZSTD_MULTITHREAD
        if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
            params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
        }
        if (params.nbWorkers > 0) {
            /* mt context creation */
            if (cctx->mtctx == NULL) {
                DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                            params.nbWorkers);
                cctx->mtctx = ZSTDMT_createCCtx_advanced(params.nbWorkers, cctx->customMem);
                if (cctx->mtctx == NULL) return ERROR(memory_allocation);
            }
            /* mt compression */
            DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
            CHECK_F( ZSTDMT_initCStream_internal(
                        cctx->mtctx,
                        prefixDict.dict, prefixDict.dictSize, ZSTD_dct_rawContent,
                        cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) );
            cctx->streamStage = zcss_load;
            cctx->appliedParams.nbWorkers = params.nbWorkers;
        } else
#endif
        {   CHECK_F( ZSTD_resetCStream_internal(cctx,
                            prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                            cctx->cdict,
                            params, cctx->pledgedSrcSizePlusOne-1) );
            assert(cctx->streamStage == zcss_load);
            assert(cctx->appliedParams.nbWorkers == 0);
    }   }
    /* end of transparent initialization stage */

    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        {   size_t const flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
            return flushMin;
    }   }
#endif
    CHECK_F( ZSTD_compressStream_generic(cctx, output, input, endOp) );
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}